

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

int covscript_args(int args_size,char **args)

{
  char *__s1;
  undefined *puVar1;
  _Alloc_hider __nptr;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  int *piVar6;
  ulong size;
  bool *pbVar7;
  fatal_error *pfVar8;
  undefined8 uVar9;
  size_type *psVar10;
  int iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  int iVar13;
  ulong uVar14;
  int local_c0;
  int local_bc;
  string local_b8;
  string local_98;
  allocator local_71;
  undefined8 local_70;
  char **local_68;
  int local_5c;
  ulong local_58;
  string local_50;
  
  bVar2 = false;
  local_68 = args;
  if (args_size < 2) {
    iVar11 = 1;
  }
  else {
    local_70 = 0;
    local_58 = (ulong)(uint)args_size;
    uVar14 = 1;
    iVar11 = 2;
    local_c0 = 0;
    local_bc = 0;
    iVar13 = 0;
    do {
      puVar1 = cs::current_process;
      paVar12 = &local_98.field_2;
      if (iVar13 == 1) {
        std::__cxx11::string::string((string *)&local_98,local_68[uVar14],(allocator *)&local_50);
        cs::process_path(&local_b8,&local_98);
        std::__cxx11::string::operator=((string *)&csym_path_abi_cxx11_,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar12) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar13 = 2;
      }
      else if (local_bc == 1) {
        std::__cxx11::string::string((string *)&local_98,local_68[uVar14],(allocator *)&local_50);
        cs::process_path(&local_b8,&local_98);
        std::__cxx11::string::operator=((string *)&log_path_abi_cxx11_,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar12) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_bc = 2;
      }
      else if (local_c0 == 1) {
        std::__cxx11::string::string((string *)&local_50,local_68[uVar14],&local_71);
        cs::process_path(&local_98,&local_50);
        plVar5 = (long *)std::__cxx11::string::insert((ulong)&local_98,0,'\x01');
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_b8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append(cs::current_process + 0x58,(ulong)local_b8._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar12) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_c0 = 2;
      }
      else if ((uint)local_70 == 1) {
        local_5c = iVar13;
        std::__cxx11::string::string((string *)&local_b8,local_68[uVar14],(allocator *)&local_50);
        __nptr._M_p = local_b8._M_dataplus._M_p;
        piVar6 = __errno_location();
        iVar13 = *piVar6;
        *piVar6 = 0;
        size = strtoul(__nptr._M_p,(char **)&local_98,10);
        if (local_98._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stoul");
LAB_001229c9:
          uVar9 = std::__throw_out_of_range("stoul");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar9);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar13;
        }
        else if (*piVar6 == 0x22) goto LAB_001229c9;
        *(ulong *)(puVar1 + 0x78) = size;
        cs::stack_type<cs_impl::any,_std::allocator>::resize
                  ((stack_type<cs_impl::any,_std::allocator> *)(puVar1 + 0x80),size);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_70 = 2;
        iVar13 = local_5c;
      }
      else {
        __s1 = local_68[uVar14];
        if (*__s1 != '-') {
          iVar11 = (int)uVar14;
          goto LAB_00122928;
        }
        iVar3 = strcmp(__s1,"--args");
        if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"-a"), iVar3 == 0)) {
          repl = true;
          return iVar11;
        }
        iVar3 = strcmp(__s1,"--silent");
        if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-s"), iVar3 == 0)) && (silent == false)) {
          pbVar7 = &silent;
        }
        else {
          iVar3 = strcmp(__s1,"--dump-ast");
          if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-d"), iVar3 == 0)) && (dump_ast == false)) {
            pbVar7 = &dump_ast;
          }
          else {
            iVar3 = strcmp(__s1,"--dependency");
            if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-r"), iVar3 == 0)) &&
               (dump_dependency == false)) {
              pbVar7 = &dump_dependency;
            }
            else {
              iVar3 = strcmp(__s1,"--no-optimize");
              if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-o"), iVar3 == 0)) &&
                 (no_optimize == false)) {
                pbVar7 = &no_optimize;
              }
              else {
                iVar3 = strcmp(__s1,"--compile-only");
                if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-c"), iVar3 == 0)) &&
                   (compile_only == false)) {
                  pbVar7 = &compile_only;
                }
                else {
                  iVar3 = strcmp(__s1,"--help");
                  if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-h"), iVar3 == 0)) &&
                     (show_help_info == false)) {
                    pbVar7 = &show_help_info;
                  }
                  else {
                    iVar3 = strcmp(__s1,"--wait-before-exit");
                    if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"-w"), iVar3 == 0)) &&
                       (wait_before_exit == false)) {
                      pbVar7 = &wait_before_exit;
                    }
                    else {
                      iVar3 = strcmp(__s1,"--version");
                      if (((iVar3 != 0) && (iVar3 = strcmp(__s1,"-v"), iVar3 != 0)) ||
                         (show_version_info != false)) {
                        iVar3 = strcmp(__s1,"--csym");
                        if (iVar3 == 0) {
                          if (iVar13 != 0) goto LAB_0012269d;
                        }
                        else {
                          iVar3 = strcmp(__s1,"-g");
                          if (iVar3 != 0 || iVar13 != 0) {
LAB_0012269d:
                            iVar3 = strcmp(__s1,"--log-path");
                            if (iVar3 == 0) {
                              if (local_bc != 0) goto LAB_0012284a;
                            }
                            else {
                              iVar3 = strcmp(__s1,"-l");
                              if (iVar3 != 0 || local_bc != 0) {
LAB_0012284a:
                                iVar3 = strcmp(__s1,"--import-path");
                                if (iVar3 == 0) {
                                  if (local_c0 != 0) goto LAB_00122883;
                                }
                                else {
                                  iVar3 = strcmp(__s1,"-i");
                                  if (iVar3 != 0 || local_c0 != 0) {
LAB_00122883:
                                    iVar3 = strcmp(__s1,"--stack-resize");
                                    if (iVar3 == 0) {
                                    }
                                    else {
                                      uVar4 = strcmp(__s1,"-S");
                                      local_70._0_4_ = uVar4 | (uint)local_70;
                                    }
                                    bVar2 = (uint)local_70 != 0;
                                    local_70 = 1;
                                    if (bVar2) {
                                      pfVar8 = (fatal_error *)__cxa_allocate_exception(0x28);
                                      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_b8,"argument syntax error.","");
                                      cs::fatal_error::fatal_error(pfVar8,&local_b8);
                                      __cxa_throw(pfVar8,&cs::fatal_error::typeinfo,
                                                  cs::fatal_error::~fatal_error);
                                    }
                                    goto LAB_0012280a;
                                  }
                                }
                                local_c0 = 1;
                                goto LAB_0012280a;
                              }
                            }
                            local_bc = 1;
                            goto LAB_0012280a;
                          }
                        }
                        iVar13 = 1;
                        goto LAB_0012280a;
                      }
                      pbVar7 = &show_version_info;
                    }
                  }
                }
              }
            }
          }
        }
        *pbVar7 = true;
      }
LAB_0012280a:
      uVar14 = uVar14 + 1;
      iVar11 = iVar11 + 1;
    } while (local_58 != uVar14);
    iVar11 = (int)local_58;
LAB_00122928:
    bVar2 = local_c0 == 1 || (local_bc == 1 || iVar13 == 1);
  }
  if (!bVar2) {
    return iVar11;
  }
  pfVar8 = (fatal_error *)__cxa_allocate_exception(0x28);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"argument syntax error.","");
  cs::fatal_error::fatal_error(pfVar8,&local_b8);
  __cxa_throw(pfVar8,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
}

Assistant:

int covscript_args(int args_size, char *args[])
{
	int expect_csym = 0;
	int expect_log_path = 0;
	int expect_import_path = 0;
	int expect_stack_resize = 0;
	int index = 1;
	for (; index < args_size; ++index) {
		if (expect_csym == 1) {
			csym_path = cs::process_path(args[index]);
			expect_csym = 2;
		}
		else if (expect_log_path == 1) {
			log_path = cs::process_path(args[index]);
			expect_log_path = 2;
		}
		else if (expect_import_path == 1) {
			cs::current_process->import_path += cs::path_delimiter + cs::process_path(args[index]);
			expect_import_path = 2;
		}
		else if (expect_stack_resize == 1) {
			cs::current_process->resize_stack(std::stoul(args[index]));
			expect_stack_resize = 2;
		}
		else if (args[index][0] == '-') {
			if (std::strcmp(args[index], "--args") == 0 || std::strcmp(args[index], "-a") == 0) {
				repl = true;
				return ++index;
			}
			else if ((std::strcmp(args[index], "--silent") == 0 || std::strcmp(args[index], "-s") == 0) && !silent)
				silent = true;
			else if ((std::strcmp(args[index], "--dump-ast") == 0 || std::strcmp(args[index], "-d") == 0) && !dump_ast)
				dump_ast = true;
			else if ((std::strcmp(args[index], "--dependency") == 0 || std::strcmp(args[index], "-r") == 0) &&
			         !dump_dependency)
				dump_dependency = true;
			else if ((std::strcmp(args[index], "--no-optimize") == 0 || std::strcmp(args[index], "-o") == 0) &&
			         !no_optimize)
				no_optimize = true;
			else if ((std::strcmp(args[index], "--compile-only") == 0 || std::strcmp(args[index], "-c") == 0) &&
			         !compile_only)
				compile_only = true;
			else if ((std::strcmp(args[index], "--help") == 0 || std::strcmp(args[index], "-h") == 0) &&
			         !show_help_info)
				show_help_info = true;
			else if ((std::strcmp(args[index], "--wait-before-exit") == 0 || std::strcmp(args[index], "-w") == 0) &&
			         !wait_before_exit)
				wait_before_exit = true;
			else if ((std::strcmp(args[index], "--version") == 0 || std::strcmp(args[index], "-v") == 0) &&
			         !show_version_info)
				show_version_info = true;
			else if ((std::strcmp(args[index], "--csym") == 0 || std::strcmp(args[index], "-g") == 0) &&
			         expect_csym == 0)
				expect_csym = 1;
			else if ((std::strcmp(args[index], "--log-path") == 0 || std::strcmp(args[index], "-l") == 0) &&
			         expect_log_path == 0)
				expect_log_path = 1;
			else if ((std::strcmp(args[index], "--import-path") == 0 || std::strcmp(args[index], "-i") == 0) &&
			         expect_import_path == 0)
				expect_import_path = 1;
			else if ((std::strcmp(args[index], "--stack-resize") == 0 || std::strcmp(args[index], "-S") == 0) &&
			         expect_stack_resize == 0)
				expect_stack_resize = 1;
			else
				throw cs::fatal_error("argument syntax error.");
		}
		else
			break;
	}
	if (expect_csym == 1 || expect_log_path == 1 || expect_import_path == 1 || expect_import_path == 1)
		throw cs::fatal_error("argument syntax error.");
	return index;
}